

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O1

void S_StopSound(sector_t *sec,int channel)

{
  FSoundChan *pFVar1;
  FSoundChan *chan;
  
  chan = Channels;
  if (Channels != (FSoundChan *)0x0) {
    do {
      pFVar1 = chan->NextChan;
      if (((chan->SourceType == '\x02') && ((chan->field_12).Actor == (AActor *)sec)) &&
         (((uint)chan->EntChannel == channel || (((byte)i_compatflags & 0x20) != 0)))) {
        S_StopChannel(chan);
      }
      chan = pFVar1;
    } while (pFVar1 != (FSoundChan *)0x0);
  }
  return;
}

Assistant:

void S_StopSound (const sector_t *sec, int channel)
{
	FSoundChan *chan = Channels;
	while (chan != NULL)
	{
		FSoundChan *next = chan->NextChan;
		if (chan->SourceType == SOURCE_Sector &&
			chan->Sector == sec &&
			(chan->EntChannel == channel || (i_compatflags & COMPATF_MAGICSILENCE)))
		{
			S_StopChannel(chan);
		}
		chan = next;
	}
}